

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O3

VectorXd __thiscall LidarMeasurement::InitializeState(LidarMeasurement *this,int n)

{
  Sensor *pSVar1;
  _func_int **pp_Var2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  long lVar7;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  VectorXd VVar11;
  Sensor *local_30 [2];
  _func_int *local_20;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,(long)in_EDX,(long)in_EDX,1);
  if (in_EDX < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  local_30[0] = (this->super_Measurement).sensor_;
  local_20 = (_func_int *)0x3fb999999999999a;
  if ((long)local_30[0] < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_30);
  pSVar1 = (this->super_Measurement).sensor_;
  if (pSVar1 != local_30[0]) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  uVar6 = (long)pSVar1 - ((long)pSVar1 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)pSVar1) {
    lVar8 = 0;
    do {
      pp_Var2 = (this->super_Measurement)._vptr_Measurement + lVar8;
      *pp_Var2 = local_20;
      pp_Var2[1] = local_20;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar6);
  }
  auVar5 = _DAT_00133420;
  auVar4 = _DAT_00133410;
  lVar8 = (long)pSVar1 % 2;
  if (lVar8 != 0 && (long)uVar6 <= (long)pSVar1) {
    pp_Var2 = (this->super_Measurement)._vptr_Measurement;
    lVar7 = lVar8 + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00133420;
    do {
      auVar10._8_4_ = (int)uVar6;
      auVar10._0_8_ = uVar6;
      auVar10._12_4_ = (int)(uVar6 >> 0x20);
      auVar10 = (auVar10 | auVar4) ^ auVar5;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        pp_Var2[((long)pSVar1 / 2) * 2 + uVar6] = local_20;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        pp_Var2[((long)pSVar1 / 2) * 2 + uVar6 + 1] = local_20;
      }
      uVar6 = uVar6 + 2;
    } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  lVar8 = *(long *)(CONCAT44(in_register_00000034,n) + 0x20);
  if (0 < lVar8) {
    pSVar1 = (this->super_Measurement).sensor_;
    if (0 < (long)pSVar1) {
      puVar3 = *(undefined8 **)(CONCAT44(in_register_00000034,n) + 0x18);
      pp_Var2 = (this->super_Measurement)._vptr_Measurement;
      *pp_Var2 = (_func_int *)*puVar3;
      if (lVar8 == 1) goto LAB_001122b9;
      if (pSVar1 != (Sensor *)0x1) {
        pp_Var2[1] = (_func_int *)puVar3[1];
        VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (DenseIndex)pSVar1;
        VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)this;
        return (VectorXd)
               VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x18a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_001122b9:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x9c,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

VectorXd LidarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(0.1);
    x(0) = measurements_[0];
    x(1) = measurements_[1];
    //x(0) = (fabs(measurements_[0]) < 0.01) ? 0.01 : measurements_[0];
    //x(1) = (fabs(measurements_[1]) < 0.01) ? 0.01 : measurements_[1];
    return x;
}